

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlType xVar2;
  xmlParserInputState xVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlParserInputPtr pxVar6;
  
  xVar2 = ctxt->mlType;
  if (xVar2 == XML_TYPE_XML) {
    pxVar6 = ctxt->input;
    pxVar5 = pxVar6->cur;
    if (((*pxVar5 != '<') || (pxVar5[1] != '?')) || ((pxVar5[2] != 'x' || (pxVar5[3] != 'm'))))
    goto LAB_00162e05;
    xVar1 = pxVar5[4];
  }
  else {
    if (xVar2 != XML_TYPE_SML) goto LAB_00162e05;
    pxVar6 = ctxt->input;
    pxVar5 = pxVar6->cur;
    if (((*pxVar5 != '?') || (pxVar5[1] != 'x')) || (pxVar5[2] != 'm')) goto LAB_00162e05;
    xVar1 = pxVar5[3];
  }
  if (((xVar1 != 'l') || (0x20 < (ulong)pxVar5[5])) ||
     ((0x100002600U >> ((ulong)pxVar5[5] & 0x3f) & 1) == 0)) {
LAB_00162e05:
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
    return;
  }
  pxVar6->cur = pxVar5 + (ulong)(xVar2 == XML_TYPE_XML) + 4;
  pxVar6->col = pxVar6->col + (uint)(xVar2 == XML_TYPE_XML) + 4;
  if (pxVar5[(ulong)(xVar2 == XML_TYPE_XML) + 4] == '\0') {
    xmlParserInputGrow(pxVar6,0xfa);
  }
  xVar3 = ctxt->instate;
  ctxt->instate = XML_PARSER_START;
  iVar4 = xmlSkipBlankChars(ctxt);
  if (iVar4 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
  }
  pxVar5 = xmlParseVersionInfo(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    pxVar5 = xmlCharStrdup("1.0");
  }
  else {
    iVar4 = xmlSkipBlankChars(ctxt);
    if (iVar4 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
    }
  }
  ctxt->input->version = pxVar5;
  pxVar5 = xmlParseEncodingDecl(ctxt);
  if (ctxt->errNo == 0x20) goto LAB_00162f15;
  if (ctxt->errNo == 0 && pxVar5 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_MISSING_ENCODING,"Missing encoding in text declaration\n");
  }
  xmlSkipBlankChars(ctxt);
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar6 = ctxt->input;
    pxVar5 = pxVar6->cur;
    if ((*pxVar5 == ';') || (*pxVar5 == '\n')) {
LAB_00162eb3:
      pxVar6->cur = pxVar5 + 2;
      pxVar6->col = pxVar6->col + 2;
      if (pxVar5[2] == '\0') {
        xmlParserInputGrow(pxVar6,0xfa);
      }
      goto LAB_00162f15;
    }
LAB_00162ed1:
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
    pxVar6 = ctxt->input;
    pxVar5 = pxVar6->cur;
    while( true ) {
      if ((*pxVar5 == '\0') || (*pxVar5 == '>')) break;
      pxVar6->cur = pxVar5 + 1;
      pxVar5 = pxVar5 + 1;
    }
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) goto LAB_00162ed1;
    pxVar6 = ctxt->input;
    pxVar5 = pxVar6->cur;
    if (*pxVar5 != '>') {
      if ((*pxVar5 == '?') && (pxVar5[1] == '>')) goto LAB_00162eb3;
      goto LAB_00162ed1;
    }
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
  }
  xmlNextChar(ctxt);
LAB_00162f15:
  ctxt->instate = xVar3;
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;
    const xmlChar *encoding;
    int oldstate;

    DEBUG_ENTER(("xmlParseTextDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP_MLI(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	RETURN();
    }

    /* Avoid expansion of parameter entities when skipping blanks. */
    oldstate = ctxt->instate;
    ctxt->instate = XML_PARSER_START;

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL)
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
    else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    encoding = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        ctxt->instate = oldstate;
        RETURN();
    }
    if ((encoding == NULL) && (ctxt->errNo == XML_ERR_OK)) {
	xmlFatalErrMsg(ctxt, XML_ERR_MISSING_ENCODING,
		       "Missing encoding in text declaration\n");
    }

    SKIP_BLANKS;
    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
        SKIP(2);
    } else if (RAW_IS_GT_MLI) { /* RAW == '>' */
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	MOVETO_ENDTAG(CUR_PTR);
	NEXT;
    }

    ctxt->instate = oldstate;
    RETURN();
}